

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey.c
# Opt level: O3

void ssort1(string *x,int n,int depth)

{
  byte bVar1;
  byte bVar2;
  string puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint n_00;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  string t;
  string *ppuVar14;
  uint uVar15;
  
  if (1 < n) {
    do {
      iVar4 = rand();
      puVar3 = *x;
      *x = x[iVar4 % n];
      x[iVar4 % n] = puVar3;
      bVar1 = (*x)[depth];
      uVar7 = n - 1;
      iVar4 = 1;
      uVar15 = 1;
      uVar5 = uVar7;
      while( true ) {
        lVar8 = (long)(int)uVar5;
        if (iVar4 <= (int)uVar5) {
          lVar10 = (long)iVar4 + -1;
          while( true ) {
            bVar2 = x[lVar10 + 1][depth];
            if (bVar1 < bVar2) break;
            if (bVar2 == bVar1) {
              puVar3 = x[(int)uVar15];
              x[(int)uVar15] = x[lVar10 + 1];
              x[lVar10 + 1] = puVar3;
              uVar15 = uVar15 + 1;
            }
            iVar4 = iVar4 + 1;
            lVar10 = lVar10 + 1;
            if (lVar8 <= lVar10) {
              iVar4 = uVar5 + 1;
              goto LAB_001dfc23;
            }
          }
        }
        if ((int)uVar5 < iVar4) break;
        lVar10 = (long)iVar4;
        lVar13 = lVar8 << 0x20;
        lVar8 = lVar8 + 1;
        while( true ) {
          puVar3 = x[lVar8 + -1];
          bVar2 = puVar3[depth];
          if (bVar2 < bVar1) break;
          if (bVar2 == bVar1) {
            x[lVar8 + -1] = x[(int)uVar7];
            x[(int)uVar7] = puVar3;
            uVar7 = uVar7 - 1;
          }
          lVar13 = lVar13 + -0x100000000;
          uVar5 = uVar5 - 1;
          lVar8 = lVar8 + -1;
          if (lVar8 <= lVar10) goto LAB_001dfc23;
        }
        puVar3 = x[lVar10];
        x[lVar10] = *(string *)((long)x + (lVar13 >> 0x1d));
        *(string *)((long)x + (lVar13 >> 0x1d)) = puVar3;
        iVar4 = iVar4 + 1;
        uVar5 = uVar5 - 1;
      }
LAB_001dfc23:
      lVar8 = (long)iVar4;
      n_00 = iVar4 - uVar15;
      lVar10 = (long)(int)n_00;
      uVar6 = n_00;
      if ((int)uVar15 < (int)n_00) {
        uVar6 = uVar15;
      }
      if (0 < (int)uVar6) {
        lVar13 = (long)(int)uVar15;
        if (lVar10 <= (int)uVar15) {
          lVar13 = lVar10;
        }
        uVar11 = 0;
        do {
          puVar3 = x[uVar11];
          x[uVar11] = x[(lVar8 + uVar11) - lVar13];
          x[(lVar8 + uVar11) - lVar13] = puVar3;
          uVar11 = uVar11 + 1;
        } while (uVar6 != uVar11);
      }
      uVar5 = uVar7 - uVar5;
      uVar9 = n + ~uVar7;
      uVar6 = uVar9;
      if ((int)uVar5 < (int)uVar9) {
        uVar6 = uVar5;
      }
      lVar13 = (long)(int)uVar5;
      if (0 < (int)uVar6) {
        lVar12 = (long)(int)uVar9;
        if (lVar13 <= (int)uVar9) {
          lVar12 = lVar13;
        }
        uVar6 = uVar6 + 1;
        ppuVar14 = x;
        do {
          puVar3 = ppuVar14[lVar8];
          ppuVar14[lVar8] = ppuVar14[n - lVar12];
          ppuVar14[n - lVar12] = puVar3;
          ppuVar14 = ppuVar14 + 1;
          uVar6 = uVar6 - 1;
        } while (1 < uVar6);
      }
      ssort1(x,n_00,depth);
      if (x[lVar10][depth] != '\0') {
        ssort1(x + lVar10,uVar15 + n + ~uVar7,depth + 1);
      }
      x = x + ((ulong)(uint)n - lVar13);
      n = uVar5;
    } while (1 < (int)uVar5);
  }
  return;
}

Assistant:

static void ssort1(string x[], int n, int depth)
{   int    a, b, c, d, r, v;
    if (n <= 1)
        return;
    a = rand() % n;
    swap(0, a);
    v = i2c(0);
    a = b = 1;
    c = d = n-1;
    for (;;) {
        while (b <= c && (r = i2c(b)-v) <= 0) {
            if (r == 0) { swap(a, b); a++; }
            b++;
        }
        while (b <= c && (r = i2c(c)-v) >= 0) {
            if (r == 0) { swap(c, d); d--; }
            c--;
        }
        if (b > c) break;
        swap(b, c);
        b++;
        c--;
    }
    r = min(a, b-a);     vecswap(0, b-r, r, x);
    r = min(d-c, n-d-1); vecswap(b, n-r, r, x);
    r = b-a; ssort1(x, r, depth);
    if (i2c(r) != 0)
        ssort1(x + r, a + n-d-1, depth+1);
    r = d-c; ssort1(x + n-r, r, depth);
}